

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void crnlib::
     vector<crnlib::hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>::raw_node>
     ::object_mover(void *pDst_void,void *pSrc_void,uint num)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  raw_node *pSrc;
  bool bVar7;
  
  if (num != 0) {
    lVar6 = 0;
    do {
      bVar7 = *(char *)((long)pSrc_void + lVar6 + 0x1c) != '\0';
      if (bVar7) {
        puVar1 = (undefined8 *)((long)pDst_void + lVar6);
        puVar2 = (undefined8 *)((long)pSrc_void + lVar6);
        uVar3 = *puVar2;
        uVar4 = puVar2[1];
        uVar5 = *(undefined8 *)((long)puVar2 + 0x14);
        *(undefined8 *)((long)puVar1 + 0xc) = *(undefined8 *)((long)puVar2 + 0xc);
        *(undefined8 *)((long)puVar1 + 0x14) = uVar5;
        *puVar1 = uVar3;
        puVar1[1] = uVar4;
      }
      *(bool *)((long)pDst_void + lVar6 + 0x1c) = bVar7;
      lVar6 = lVar6 + 0x20;
    } while ((ulong)num << 5 != lVar6);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }